

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Element * Rml::QuerySelectorMatchRecursive
                    (StyleSheetNodeListRaw *nodes,Element *element,Element *scope)

{
  pointer ppSVar1;
  bool bVar2;
  Element *pEVar3;
  int index;
  int iVar4;
  pointer ppSVar5;
  StyleSheetNodeListRaw *__range2;
  
  iVar4 = (int)((ulong)((long)(element->children).
                              super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(element->children).
                             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) -
          element->num_non_dom_children;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  index = 0;
  do {
    if (index == iVar4) {
      return (Element *)0x0;
    }
    pEVar3 = Element::GetChild(element,index);
    bVar2 = ::std::operator==(&pEVar3->tag,"#text");
    if (!bVar2) {
      ppSVar5 = (nodes->
                super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppSVar1 = (nodes->
                super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      while (ppSVar5 != ppSVar1) {
        bVar2 = StyleSheetNode::IsApplicable(*ppSVar5,pEVar3,scope);
        ppSVar5 = ppSVar5 + 1;
        if (bVar2) {
          return pEVar3;
        }
      }
      pEVar3 = QuerySelectorMatchRecursive(nodes,pEVar3,scope);
      if (pEVar3 != (Element *)0x0) {
        return pEVar3;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

static Element* QuerySelectorMatchRecursive(const StyleSheetNodeListRaw& nodes, Element* element, Element* scope)
{
	const int num_children = element->GetNumChildren();

	for (int i = 0; i < num_children; i++)
	{
		Element* child = element->GetChild(i);
		if (child->GetTagName() == "#text")
			continue;

		for (const StyleSheetNode* node : nodes)
		{
			if (node->IsApplicable(child, scope))
				return child;
		}

		Element* matching_element = QuerySelectorMatchRecursive(nodes, child, scope);
		if (matching_element)
			return matching_element;
	}

	return nullptr;
}